

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# AllSyntax.h
# Opt level: O3

void __thiscall
slang::syntax::ClassDeclarationSyntax::ClassDeclarationSyntax
          (ClassDeclarationSyntax *this,
          SyntaxList<slang::syntax::AttributeInstanceSyntax> *attributes,Token virtualOrInterface,
          Token classKeyword,Token lifetime,Token name,ParameterPortListSyntax *parameters,
          ExtendsClauseSyntax *extendsClause,ImplementsClauseSyntax *implementsClause,Token semi,
          SyntaxList<slang::syntax::MemberSyntax> *items,Token endClass,
          NamedBlockClauseSyntax *endBlockName)

{
  size_type sVar1;
  pointer ppAVar2;
  pointer ppMVar3;
  SyntaxKind SVar4;
  undefined4 uVar5;
  long lVar6;
  undefined8 uVar7;
  undefined8 uVar8;
  
  uVar8 = classKeyword._0_8_;
  uVar7 = virtualOrInterface._0_8_;
  (this->super_MemberSyntax).super_SyntaxNode.parent = (SyntaxNode *)0x0;
  (this->super_MemberSyntax).super_SyntaxNode.kind = ClassDeclaration;
  SVar4 = (attributes->super_SyntaxListBase).super_SyntaxNode.kind;
  uVar5 = *(undefined4 *)&(attributes->super_SyntaxListBase).super_SyntaxNode.field_0xc;
  (this->super_MemberSyntax).attributes.super_SyntaxListBase.super_SyntaxNode.parent =
       (attributes->super_SyntaxListBase).super_SyntaxNode.parent;
  (this->super_MemberSyntax).attributes.super_SyntaxListBase.super_SyntaxNode.kind = SVar4;
  *(undefined4 *)
   &(this->super_MemberSyntax).attributes.super_SyntaxListBase.super_SyntaxNode.field_0xc = uVar5;
  (this->super_MemberSyntax).attributes.super_SyntaxListBase._vptr_SyntaxListBase =
       (_func_int **)&PTR___cxa_pure_virtual_00507f08;
  (this->super_MemberSyntax).attributes.super_SyntaxListBase.childCount =
       (attributes->super_SyntaxListBase).childCount;
  sVar1 = (attributes->super_span<slang::syntax::AttributeInstanceSyntax_*,_18446744073709551615UL>)
          .size_;
  (this->super_MemberSyntax).attributes.
  super_span<slang::syntax::AttributeInstanceSyntax_*,_18446744073709551615UL>.data_ =
       (attributes->super_span<slang::syntax::AttributeInstanceSyntax_*,_18446744073709551615UL>).
       data_;
  (this->super_MemberSyntax).attributes.
  super_span<slang::syntax::AttributeInstanceSyntax_*,_18446744073709551615UL>.size_ = sVar1;
  (this->super_MemberSyntax).attributes.super_SyntaxListBase._vptr_SyntaxListBase =
       (_func_int **)&PTR_getChild_00508348;
  (this->super_MemberSyntax).attributes.super_SyntaxListBase.super_SyntaxNode.parent =
       (SyntaxNode *)this;
  sVar1 = (this->super_MemberSyntax).attributes.
          super_span<slang::syntax::AttributeInstanceSyntax_*,_18446744073709551615UL>.size_;
  if (sVar1 != 0) {
    ppAVar2 = (this->super_MemberSyntax).attributes.
              super_span<slang::syntax::AttributeInstanceSyntax_*,_18446744073709551615UL>.data_;
    lVar6 = 0;
    do {
      **(undefined8 **)((long)ppAVar2 + lVar6) = this;
      lVar6 = lVar6 + 8;
    } while (sVar1 << 3 != lVar6);
  }
  (this->virtualOrInterface).kind = (short)uVar7;
  (this->virtualOrInterface).field_0x2 = (char)((ulong)uVar7 >> 0x10);
  (this->virtualOrInterface).numFlags = (NumericTokenFlags)(char)((ulong)uVar7 >> 0x18);
  (this->virtualOrInterface).rawLen = (int)((ulong)uVar7 >> 0x20);
  (this->virtualOrInterface).info = virtualOrInterface.info;
  (this->classKeyword).kind = (short)uVar8;
  (this->classKeyword).field_0x2 = (char)((ulong)uVar8 >> 0x10);
  (this->classKeyword).numFlags = (NumericTokenFlags)(char)((ulong)uVar8 >> 0x18);
  (this->classKeyword).rawLen = (int)((ulong)uVar8 >> 0x20);
  (this->classKeyword).info = classKeyword.info;
  (this->lifetime).kind = lifetime.kind;
  (this->lifetime).field_0x2 = lifetime._2_1_;
  (this->lifetime).numFlags = (NumericTokenFlags)lifetime.numFlags.raw;
  (this->lifetime).rawLen = lifetime.rawLen;
  (this->lifetime).info = lifetime.info;
  (this->name).kind = name.kind;
  (this->name).field_0x2 = name._2_1_;
  (this->name).numFlags = (NumericTokenFlags)name.numFlags.raw;
  (this->name).rawLen = name.rawLen;
  (this->name).info = name.info;
  this->parameters = parameters;
  this->extendsClause = extendsClause;
  this->implementsClause = implementsClause;
  (this->semi).kind = semi.kind;
  (this->semi).field_0x2 = semi._2_1_;
  (this->semi).numFlags = (NumericTokenFlags)semi.numFlags.raw;
  (this->semi).rawLen = semi.rawLen;
  (this->semi).info = semi.info;
  SVar4 = (items->super_SyntaxListBase).super_SyntaxNode.kind;
  uVar5 = *(undefined4 *)&(items->super_SyntaxListBase).super_SyntaxNode.field_0xc;
  (this->items).super_SyntaxListBase.super_SyntaxNode.parent =
       (items->super_SyntaxListBase).super_SyntaxNode.parent;
  (this->items).super_SyntaxListBase.super_SyntaxNode.kind = SVar4;
  *(undefined4 *)&(this->items).super_SyntaxListBase.super_SyntaxNode.field_0xc = uVar5;
  (this->items).super_SyntaxListBase._vptr_SyntaxListBase =
       (_func_int **)&PTR___cxa_pure_virtual_00507f08;
  (this->items).super_SyntaxListBase.childCount = (items->super_SyntaxListBase).childCount;
  sVar1 = (items->super_span<slang::syntax::MemberSyntax_*,_18446744073709551615UL>).size_;
  (this->items).super_span<slang::syntax::MemberSyntax_*,_18446744073709551615UL>.data_ =
       (items->super_span<slang::syntax::MemberSyntax_*,_18446744073709551615UL>).data_;
  (this->items).super_span<slang::syntax::MemberSyntax_*,_18446744073709551615UL>.size_ = sVar1;
  (this->items).super_SyntaxListBase._vptr_SyntaxListBase = (_func_int **)&PTR_getChild_0050b010;
  (this->endClass).kind = endClass.kind;
  (this->endClass).field_0x2 = endClass._2_1_;
  (this->endClass).numFlags = (NumericTokenFlags)endClass.numFlags.raw;
  (this->endClass).rawLen = endClass.rawLen;
  (this->endClass).info = endClass.info;
  this->endBlockName = endBlockName;
  if (parameters != (ParameterPortListSyntax *)0x0) {
    (parameters->super_SyntaxNode).parent = (SyntaxNode *)this;
  }
  if (extendsClause != (ExtendsClauseSyntax *)0x0) {
    (extendsClause->super_SyntaxNode).parent = (SyntaxNode *)this;
  }
  if (implementsClause != (ImplementsClauseSyntax *)0x0) {
    (implementsClause->super_SyntaxNode).parent = (SyntaxNode *)this;
  }
  (this->items).super_SyntaxListBase.super_SyntaxNode.parent = (SyntaxNode *)this;
  sVar1 = (this->items).super_span<slang::syntax::MemberSyntax_*,_18446744073709551615UL>.size_;
  if (sVar1 != 0) {
    ppMVar3 = (this->items).super_span<slang::syntax::MemberSyntax_*,_18446744073709551615UL>.data_;
    lVar6 = 0;
    do {
      **(undefined8 **)((long)ppMVar3 + lVar6) = this;
      lVar6 = lVar6 + 8;
    } while (sVar1 << 3 != lVar6);
  }
  if (endBlockName != (NamedBlockClauseSyntax *)0x0) {
    (endBlockName->super_SyntaxNode).parent = (SyntaxNode *)this;
  }
  return;
}

Assistant:

ClassDeclarationSyntax(const SyntaxList<AttributeInstanceSyntax>& attributes, Token virtualOrInterface, Token classKeyword, Token lifetime, Token name, ParameterPortListSyntax* parameters, ExtendsClauseSyntax* extendsClause, ImplementsClauseSyntax* implementsClause, Token semi, const SyntaxList<MemberSyntax>& items, Token endClass, NamedBlockClauseSyntax* endBlockName) :
        MemberSyntax(SyntaxKind::ClassDeclaration, attributes), virtualOrInterface(virtualOrInterface), classKeyword(classKeyword), lifetime(lifetime), name(name), parameters(parameters), extendsClause(extendsClause), implementsClause(implementsClause), semi(semi), items(items), endClass(endClass), endBlockName(endBlockName) {
        if (this->parameters) this->parameters->parent = this;
        if (this->extendsClause) this->extendsClause->parent = this;
        if (this->implementsClause) this->implementsClause->parent = this;
        this->items.parent = this;
        for (auto child : this->items)
            child->parent = this;
        if (this->endBlockName) this->endBlockName->parent = this;
    }